

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O2

bool __thiscall
net_peer_eviction_tests::IsProtected
          (net_peer_eviction_tests *this,int num_peers,
          function<void_(NodeEvictionCandidate_&)> candidate_setup_fn,
          unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *protected_peer_ids,
          unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *unprotected_peer_ids,FastRandomContext *random_context)

{
  ulong uVar1;
  size_type sVar2;
  unit_test_log_t *puVar3;
  unit_test_log_t *puVar4;
  bool bVar5;
  undefined4 in_register_00000034;
  FastRandomContext *pFVar6;
  unsigned_long *args_1;
  iterator in_R9;
  NodeEvictionCandidate *candidate;
  pointer __args;
  size_type sVar7;
  pointer pNVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  unit_test_log_t local_f8;
  undefined1 local_e9;
  begin local_e8;
  size_t unprotected_count;
  char *local_c8;
  char *local_c0;
  lazy_ostream local_b8;
  undefined1 *local_a8;
  string *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  size_t expected;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> candidates;
  string local_58;
  long local_38;
  
  puVar3 = &local_f8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar6 = random_context;
  GetRandomNodeEvictionCandidates(&candidates,(int)this,random_context);
  pNVar8 = candidates.
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (__args = candidates.
                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                _M_impl.super__Vector_impl_data._M_start; __args != pNVar8; __args = __args + 1) {
    std::function<void_(NodeEvictionCandidate_&)>::operator()
              ((function<void_(NodeEvictionCandidate_&)> *)CONCAT44(in_register_00000034,num_peers),
               __args);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,FastRandomContext&>
            ((__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )candidates.
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )candidates.
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_finish,random_context);
  uVar1 = ((long)candidates.
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)candidates.
                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x48;
  expected = uVar1 - (uVar1 >> 1);
  ProtectEvictionCandidatesByRatio(&candidates);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x27;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)pFVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  local_b8.m_empty = false;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)0xc7f1cc;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_c0 = "";
  local_58._M_dataplus._M_p =
       (pointer)(((long)candidates.
                        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)candidates.
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  args_1 = (unsigned_long *)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_b8,&local_c8,0x27,1,2,&local_58,"candidates.size()",&expected,"expected");
  unprotected_count = 0;
  sVar7 = 0;
  pNVar8 = candidates.
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pNVar8 == candidates.
                  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = true;
      if (sVar7 != (unprotected_peer_ids->_M_h)._M_element_count) {
        local_e8.m_file_name.m_begin =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
        ;
        local_e8.m_file_name.m_end = "";
        local_e8.m_line_num = 0x39;
        puVar3 = boost::unit_test::unit_test_log_t::operator<<
                           (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
        boost::unit_test::unit_test_log_t::operator()
                  ((unit_test_log_t *)&local_e9,(log_level)puVar3);
        local_f8.super_test_observer._vptr_test_observer =
             (test_observer)(unprotected_peer_ids->_M_h)._M_element_count;
        tinyformat::format<unsigned_long,unsigned_long>
                  (&local_58,(tinyformat *)"unprotected: expected %d, actual %d",(char *)&local_f8,
                   &unprotected_count,args_1);
        local_b8.m_empty = false;
        local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01147fb0;
        local_a8 = boost::unit_test::lazy_ostream::inst;
        local_a0 = &local_58;
        boost::unit_test::ut_detail::entry_value_collector::operator<<
                  ((entry_value_collector *)&local_e9,&local_b8);
        std::__cxx11::string::~string((string *)&local_58);
        puVar3 = (unit_test_log_t *)&local_e9;
LAB_003dba60:
        boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                  ((entry_value_collector *)puVar3);
        bVar5 = false;
      }
      std::_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::
      ~_Vector_base(&candidates.
                     super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                   );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar5;
      }
      __stack_chk_fail();
    }
    sVar2 = std::
            _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&protected_peer_ids->_M_h,&pNVar8->id);
    if (sVar2 != 0) {
      local_e8.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
      ;
      local_e8.m_file_name.m_end = "";
      local_e8.m_line_num = 0x2d;
      puVar4 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
      boost::unit_test::unit_test_log_t::operator()(&local_f8,(log_level)puVar4);
      tinyformat::format<long>(&local_58,"expected candidate to be protected: %d",&pNVar8->id);
      local_b8.m_empty = false;
      local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01147fb0;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_a0 = &local_58;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_f8,&local_b8);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_003dba60;
    }
    sVar2 = std::
            _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&unprotected_peer_ids->_M_h,&pNVar8->id);
    if (sVar2 != 0) {
      sVar7 = sVar7 + 1;
      unprotected_count = sVar7;
    }
    pNVar8 = pNVar8 + 1;
  } while( true );
}

Assistant:

bool IsProtected(int num_peers,
                 std::function<void(NodeEvictionCandidate&)> candidate_setup_fn,
                 const std::unordered_set<NodeId>& protected_peer_ids,
                 const std::unordered_set<NodeId>& unprotected_peer_ids,
                 FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates{GetRandomNodeEvictionCandidates(num_peers, random_context)};
    for (NodeEvictionCandidate& candidate : candidates) {
        candidate_setup_fn(candidate);
    }
    std::shuffle(candidates.begin(), candidates.end(), random_context);

    const size_t size{candidates.size()};
    const size_t expected{size - size / 2}; // Expect half the candidates will be protected.
    ProtectEvictionCandidatesByRatio(candidates);
    BOOST_CHECK_EQUAL(candidates.size(), expected);

    size_t unprotected_count{0};
    for (const NodeEvictionCandidate& candidate : candidates) {
        if (protected_peer_ids.count(candidate.id)) {
            // this peer should have been removed from the eviction candidates
            BOOST_TEST_MESSAGE(strprintf("expected candidate to be protected: %d", candidate.id));
            return false;
        }
        if (unprotected_peer_ids.count(candidate.id)) {
            // this peer remains in the eviction candidates, as expected
            ++unprotected_count;
        }
    }

    const bool is_protected{unprotected_count == unprotected_peer_ids.size()};
    if (!is_protected) {
        BOOST_TEST_MESSAGE(strprintf("unprotected: expected %d, actual %d",
                                     unprotected_peer_ids.size(), unprotected_count));
    }
    return is_protected;
}